

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  RunProgramm *this;
  string local_40;
  allocator local_19;
  
  this = (RunProgramm *)operator_new(0x30);
  std::__cxx11::string::string((string *)&local_40,argv[1],&local_19);
  RunProgramm::RunProgramm(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  RunProgramm::run(this);
  RunProgramm::~RunProgramm(this);
  operator_delete(this,0x30);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  (void) argc;
  RunProgramm *programm = new RunProgramm(argv[FILE_NAME_ARG_INDEX]);
  programm->run();
  delete (programm);
  return 0;
}